

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow *window,ImGuiViewportP *viewport)

{
  ImGuiWindow *pIVar1;
  ImGuiViewportP *pIVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  bool bVar6;
  undefined4 extraout_EAX;
  int iVar7;
  undefined4 extraout_EAX_00;
  int iVar8;
  ImGuiWindow **ppIVar9;
  int n;
  ImVector<ImGuiWindow_*> *this;
  ImRect IVar10;
  ImRect IVar11;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  pIVar5 = GImGui;
  if ((window->Viewport != viewport) &&
     (((viewport->super_ImGuiViewport).Flags & 0x1400U) == 0x1000)) {
    IVar10 = ImGuiViewportP::GetMainRect(viewport);
    IVar11 = ImGuiWindow::Rect(window);
    local_38 = IVar10.Max.x;
    fStack_34 = IVar10.Max.y;
    auVar3._4_4_ = -(uint)(IVar11.Max.y <= fStack_34);
    auVar3._0_4_ = -(uint)(IVar11.Max.x <= local_38);
    auVar3._8_4_ = -(uint)(IVar10.Min.x <= IVar11.Min.x);
    auVar3._12_4_ = -(uint)(IVar10.Min.y <= IVar11.Min.y);
    iVar7 = movmskps(extraout_EAX,auVar3);
    if (iVar7 == 0xf) {
      bVar6 = GetWindowAlwaysWantOwnViewport(window);
      iVar7 = 0;
      if (!bVar6) {
        this = &pIVar5->Windows;
        for (; iVar7 < this->Size; iVar7 = iVar7 + 1) {
          ppIVar9 = ImVector<ImGuiWindow_*>::operator[](this,iVar7);
          pIVar1 = *ppIVar9;
          if (pIVar1 == window) break;
          if (((pIVar1->WasActive == true) && (pIVar1->ViewportOwned == true)) &&
             ((pIVar1->Flags & 0x1000000) == 0)) {
            IVar10 = ImGuiViewportP::GetMainRect(pIVar1->Viewport);
            IVar11 = ImGuiWindow::Rect(window);
            local_48 = IVar10.Max.x;
            fStack_44 = IVar10.Max.y;
            local_38 = IVar10.Min.x;
            fStack_34 = IVar10.Min.y;
            auVar4._4_4_ = -(uint)(local_38 < IVar11.Max.x);
            auVar4._0_4_ = -(uint)(fStack_34 < IVar11.Max.y);
            auVar4._8_4_ = -(uint)(IVar11.Min.y < fStack_44);
            auVar4._12_4_ = -(uint)(IVar11.Min.x < local_48);
            iVar8 = movmskps(extraout_EAX_00,auVar4);
            if (iVar8 == 0xf) goto LAB_00129d36;
          }
        }
        if (window->ViewportOwned == true) {
          pIVar2 = window->Viewport;
          for (iVar7 = 0; iVar7 < this->Size; iVar7 = iVar7 + 1) {
            ppIVar9 = ImVector<ImGuiWindow_*>::operator[](this,iVar7);
            if ((*ppIVar9)->Viewport == pIVar2) {
              ppIVar9 = ImVector<ImGuiWindow_*>::operator[](this,iVar7);
              SetWindowViewport(*ppIVar9,viewport);
            }
          }
        }
        SetWindowViewport(window,viewport);
        BringWindowToDisplayFront(window);
        iVar7 = 1;
      }
      goto LAB_00129d38;
    }
  }
LAB_00129d36:
  iVar7 = 0;
LAB_00129d38:
  return SUB41(iVar7,0);
}

Assistant:

static bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow* window, ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    if (window->Viewport == viewport)
        return false;
    if ((viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows) == 0)
        return false;
    if ((viewport->Flags & ImGuiViewportFlags_Minimized) != 0)
        return false;
    if (!viewport->GetMainRect().Contains(window->Rect()))
        return false;
    if (GetWindowAlwaysWantOwnViewport(window))
        return false;

    // FIXME: Can't use g.WindowsFocusOrder[] for root windows only as we care about Z order. If we maintained a DisplayOrder along with FocusOrder we could..
    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window_behind = g.Windows[n];
        if (window_behind == window)
            break;
        if (window_behind->WasActive && window_behind->ViewportOwned && !(window_behind->Flags & ImGuiWindowFlags_ChildWindow))
            if (window_behind->Viewport->GetMainRect().Overlaps(window->Rect()))
                return false;
    }

    // Move to the existing viewport, Move child/hosted windows as well (FIXME-OPT: iterate child)
    ImGuiViewportP* old_viewport = window->Viewport;
    if (window->ViewportOwned)
        for (int n = 0; n < g.Windows.Size; n++)
            if (g.Windows[n]->Viewport == old_viewport)
                SetWindowViewport(g.Windows[n], viewport);
    SetWindowViewport(window, viewport);
    BringWindowToDisplayFront(window);

    return true;
}